

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

ssize_t __thiscall Omega_h::binary::read(binary *this,int __fd,void *__buf,size_t __nbytes)

{
  Library *library_in;
  undefined4 in_register_00000034;
  ScopedTimer timer;
  ScopedTimer local_39;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  begin_code("binary::read(path, comm, strict)",(char *)0x0);
  library_in = Comm::library(*__buf);
  Omega_h::Mesh::Mesh((Mesh *)this,library_in);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,(__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)__buf);
  read((binary *)CONCAT44(in_register_00000034,__fd),(int)&local_38,this,__nbytes & 0xff);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  ScopedTimer::~ScopedTimer(&local_39);
  return (ssize_t)this;
}

Assistant:

Mesh read(filesystem::path const& path, CommPtr comm, bool strict) {
  ScopedTimer timer("binary::read(path, comm, strict)");
  auto mesh = Mesh(comm->library());
  binary::read(path, comm, &mesh, strict);
  return mesh;
}